

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverAlgebraicSubtract(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  bool bVar1;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar2;
  bool bVar3;
  Mvc_List_t *pList;
  int _i_;
  int CompResult;
  int fFound;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pCube2;
  Mvc_Cube_t *pCube1;
  Mvc_Cover_t *pCover;
  Mvc_Cover_t *pCover2_local;
  Mvc_Cover_t *pCover1_local;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcOpAlg.c"
                  ,0x60,"Mvc_Cover_t *Mvc_CoverAlgebraicSubtract(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pCover_00 = Mvc_CoverClone(pCover1);
  pCube2 = (pCover1->lCubes).pHead;
  do {
    if (pCube2 == (Mvc_Cube_t *)0x0) {
      return pCover_00;
    }
    bVar1 = false;
    for (pCube = (pCover2->lCubes).pHead; pCube != (Mvc_Cube_t *)0x0; pCube = pCube->pNext) {
      if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 0) {
        bVar3 = pCube2->pData[0] == pCube->pData[0];
      }
      else if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 1) {
        bVar3 = false;
        if (pCube2->pData[0] == pCube->pData[0]) {
          bVar3 = *(int *)&pCube2->field_0x14 == *(int *)&pCube->field_0x14;
        }
      }
      else {
        bVar3 = true;
        for (pList._4_4_ = *(uint *)&pCube2->field_0x8 & 0xffffff; -1 < (int)pList._4_4_;
            pList._4_4_ = pList._4_4_ - 1) {
          if (pCube2->pData[(int)pList._4_4_] != pCube->pData[(int)pList._4_4_]) {
            bVar3 = false;
            break;
          }
        }
      }
      if (bVar3) {
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      pMVar2 = Mvc_CubeDup(pCover_00,pCube2);
      if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
        (pCover_00->lCubes).pHead = pMVar2;
      }
      else {
        ((pCover_00->lCubes).pTail)->pNext = pMVar2;
      }
      (pCover_00->lCubes).pTail = pMVar2;
      pMVar2->pNext = (Mvc_Cube_t *)0x0;
      (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
    }
    pCube2 = pCube2->pNext;
  } while( true );
}

Assistant:

Mvc_Cover_t * Mvc_CoverAlgebraicSubtract( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube1, * pCube2, * pCube;
    int fFound;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );

    // iterate through the cubes
    pCover = Mvc_CoverClone( pCover1 );
    Mvc_CoverForEachCube( pCover1, pCube1 )
    {
        fFound = 0;
        Mvc_CoverForEachCube( pCover2, pCube2 )
        {
            Mvc_CubeBitEqual( CompResult, pCube1, pCube2 );
            if ( CompResult )
            {
                fFound = 1;
                break;
            }
        }
        if ( !fFound )
        { 
            // create the copy of the cube
            pCube = Mvc_CubeDup( pCover, pCube1 );
            // add the cube copy to the cover
            Mvc_CoverAddCubeTail( pCover, pCube );
        }
    }
    return pCover;
}